

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O1

void idx2::Resize(volume *Vol,v3i *Dims3,allocator *Alloc)

{
  long lVar1;
  long lVar2;
  
  if ((ulong)Vol->Type < 10) {
    lVar2 = *(long *)(&DAT_001a8d98 + (ulong)Vol->Type * 8);
  }
  else {
    lVar2 = 0;
  }
  lVar2 = (long)(Dims3->field_0).field_0.Z *
          (long)(Dims3->field_0).field_0.Y * (long)(Dims3->field_0).field_0.X * lVar2;
  lVar1 = (Vol->Buffer).Bytes;
  if (lVar1 < lVar2) {
    if (0 < lVar1) {
      DeallocBuf(&Vol->Buffer);
    }
    AllocBuf(&Vol->Buffer,lVar2,Alloc);
  }
  Vol->Dims = (ulong)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a |
              ((ulong)(uint)(Dims3->field_0).field_0.Y & 0x1fffff) << 0x15 |
              (ulong)(uint)(Dims3->field_0).field_0.X & 0x1fffff;
  return;
}

Assistant:

void
Resize(volume* Vol, const v3i& Dims3, allocator* Alloc)
{
  idx2_Assert(Vol->Type != dtype::__Invalid__);
  i64 NewSize = Prod<u64>(Dims3) * SizeOf(Vol->Type);
  if (Size(Vol->Buffer) < NewSize)
    Resize(&Vol->Buffer, NewSize, Alloc);
  SetDims(Vol, Dims3);
}